

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

string * fs_user_config_dir_abi_cxx11_(void)

{
  ulong uVar1;
  string *in_RDI;
  bool bVar2;
  string_view local_60;
  undefined1 local_50 [8];
  string h_1;
  string_view local_28;
  byte local_11;
  string *h;
  
  local_11 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"XDG_CONFIG_HOME");
  fs_getenv_abi_cxx11_(in_RDI,local_28);
  uVar1 = std::__cxx11::string::empty();
  h_1.field_2._M_local_buf[0xc] = (uVar1 & 1) == 0;
  if ((bool)h_1.field_2._M_local_buf[0xc]) {
    local_11 = 1;
  }
  h_1.field_2._13_3_ = 0;
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  if (h_1.field_2._12_4_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"HOME");
    fs_getenv_abi_cxx11_((string *)local_50,local_60);
    uVar1 = std::__cxx11::string::empty();
    bVar2 = (uVar1 & 1) == 0;
    if (bVar2) {
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"/.config");
    }
    h_1.field_2._13_3_ = 0;
    h_1.field_2._M_local_buf[0xc] = bVar2;
    std::__cxx11::string::~string((string *)local_50);
    if (h_1.field_2._12_4_ == 0) {
      fs_print_error("","fs_user_config_dir");
      std::__cxx11::string::string((string *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::string fs_user_config_dir()
{
#if defined(_WIN32)
  PWSTR s = nullptr;
  std::string r;
  if(SHGetKnownFolderPath(FOLDERID_LocalAppData, 0, nullptr, &s) == S_OK)  FFS_LIKELY
    r = fs_as_posix(fs_win32_to_narrow(s));

  CoTaskMemFree(s);
  // https://learn.microsoft.com/en-us/windows/win32/api/combaseapi/nf-combaseapi-cotaskmemfree

  if (!r.empty())  FFS_LIKELY
    return r;
#else
  if(std::string h = fs_getenv("XDG_CONFIG_HOME"); !h.empty())
    return h;
  if(std::string h = fs_getenv("HOME"); !h.empty())
    return h + "/.config";
#endif

  fs_print_error("", __func__);
  return {};
}